

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeResolveLabel(Vdbe *v,int x)

{
  Parse *p_00;
  int j;
  Parse *p;
  int x_local;
  Vdbe *v_local;
  
  p_00 = v->pParse;
  if (p_00->nLabelAlloc + p_00->nLabel < 0) {
    resizeResolveLabel(p_00,v,x ^ 0xffffffffU);
  }
  else {
    p_00->aLabel[(int)(x ^ 0xffffffffU)] = v->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeResolveLabel(Vdbe *v, int x){
  Parse *p = v->pParse;
  int j = ADDR(x);
  assert( v->magic==VDBE_MAGIC_INIT );
  assert( j<-p->nLabel );
  assert( j>=0 );
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    printf("RESOLVE LABEL %d to %d\n", x, v->nOp);
  }
#endif
  if( p->nLabelAlloc + p->nLabel < 0 ){
    resizeResolveLabel(p,v,j);
  }else{
    assert( p->aLabel[j]==(-1) ); /* Labels may only be resolved once */
    p->aLabel[j] = v->nOp;
  }
}